

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::dot(BrailleCanvas *this,Color *color,Point p,TerminalOp op)

{
  GenericPoint<long> p_00;
  bool bVar1;
  size_t col;
  block_t *src;
  long lVar2;
  block_t local_94;
  BrailleCanvas *local_80;
  long local_78;
  Size local_70;
  GenericPoint<long> local_60;
  GenericRect<long> local_50;
  TerminalOp local_2c;
  Color *pCStack_28;
  TerminalOp op_local;
  Color *color_local;
  BrailleCanvas *this_local;
  Point p_local;
  
  p_local.x = p.y;
  this_local = (BrailleCanvas *)p.x;
  local_2c = op;
  pCStack_28 = color;
  color_local = (Color *)this;
  memset(&local_60,0,0x10);
  GenericPoint<long>::GenericPoint(&local_60);
  local_70 = size(this);
  GenericRect<long>::GenericRect(&local_50,&local_60,&local_70);
  local_80 = this_local;
  local_78 = p_local.x;
  p_00.y = p_local.x;
  p_00.x = (long)this_local;
  bVar1 = GenericRect<long>::contains(&local_50,p_00);
  if (bVar1) {
    lVar2 = p_local.x;
    if (p_local.x < 0) {
      lVar2 = p_local.x + 3;
    }
    col = (long)this_local / 2;
    detail::braille::block_t::block_t(&local_94,*pCStack_28,'\0');
    src = detail::braille::block_t::set(&local_94,(long)this_local % 2,p_local.x % 4);
    paint(this,lVar2 >> 2,col,src,local_2c);
  }
  return this;
}

Assistant:

BrailleCanvas& dot(Color const& color, Point p, TerminalOp op = TerminalOp::Over) {
        if (Rect({}, size()).contains(p)) {
            paint(p.y / cell_rows, p.x / cell_cols, detail::braille::block_t(color).set(p.x % cell_cols, p.y % cell_rows), op);
        }
        return *this;
    }